

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSpeedup.c
# Opt level: O1

int Gia_LutWhereIsPin(Gia_Man_t *p,int iFanout,int iFanin,int *pPinPerm)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int *piVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (-1 < iFanout) {
    iVar2 = p->vMapping->nSize;
    if (iFanout < iVar2) {
      piVar5 = p->vMapping->pArray;
      iVar3 = piVar5[(uint)iFanout];
      if ((-1 < (long)iVar3) && (iVar3 < iVar2)) {
        puVar1 = (uint *)(piVar5 + iVar3);
        uVar4 = *puVar1;
        uVar6 = 0;
        uVar7 = (ulong)uVar4;
        if ((int)uVar4 < 1) {
          uVar7 = 0;
        }
        do {
          if (uVar7 == uVar6) {
            uVar6 = 0xffffffff;
LAB_002293cc:
            return (int)uVar6;
          }
          if (puVar1[(long)pPinPerm[uVar6] + 1] == iFanin) goto LAB_002293cc;
          uVar6 = uVar6 + 1;
        } while (-1 < iFanout);
      }
    }
  }
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

int Gia_LutWhereIsPin( Gia_Man_t * p, int iFanout, int iFanin, int * pPinPerm )
{
    int i;
    for ( i = 0; i < Gia_ObjLutSize(p, iFanout); i++ )
        if ( Gia_ObjLutFanin(p, iFanout, pPinPerm[i]) == iFanin )
            return i;
    return -1;
}